

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofRAngle.cpp
# Opt level: O2

void __thiscall
OpenMD::GofRAngle::GofRAngle
          (GofRAngle *this,SimInfo *info,string *filename,string *sele1,string *sele2,RealType len,
          int nrbins,int nangleBins)

{
  ostream *poVar1;
  long lVar2;
  uint i;
  ulong uVar3;
  string paramString;
  stringstream params;
  allocator<char> local_1d8 [32];
  string local_1b8 [16];
  ostream local_1a8 [376];
  
  RadialDistrFunc::RadialDistrFunc(&this->super_RadialDistrFunc,info,filename,sele1,sele2,nrbins);
  (this->super_RadialDistrFunc).super_StaticAnalyser._vptr_StaticAnalyser =
       (_func_int **)&PTR__GofRAngle_002ed048;
  this->nAngleBins_ = nangleBins;
  this->len_ = len;
  this->doSele3_ = false;
  (this->selectionScript3_)._M_dataplus._M_p = (pointer)&(this->selectionScript3_).field_2;
  (this->selectionScript3_)._M_string_length = 0;
  (this->selectionScript3_).field_2._M_local_buf[0] = '\0';
  SelectionManager::SelectionManager(&this->seleMan3_,info);
  SelectionEvaluator::SelectionEvaluator(&this->evaluator3_,info);
  (this->avgGofr_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->avgGofr_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->histogram_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->avgGofr_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->histogram_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->histogram_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar3 = (ulong)(this->super_RadialDistrFunc).super_StaticAnalyser.nBins_;
  this->deltaR_ = this->len_ / (double)uVar3;
  this->deltaCosAngle_ = 2.0 / (double)this->nAngleBins_;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&this->histogram_,uVar3);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(&this->avgGofr_,(ulong)(this->super_RadialDistrFunc).super_StaticAnalyser.nBins_);
  lVar2 = 0;
  for (uVar3 = 0; uVar3 < (this->super_RadialDistrFunc).super_StaticAnalyser.nBins_;
      uVar3 = uVar3 + 1) {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               ((long)&(((this->histogram_).
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data + lVar2),(long)this->nAngleBins_);
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)
               ((long)&(((this->avgGofr_).
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + lVar2),(long)this->nAngleBins_);
    lVar2 = lVar2 + 0x18;
  }
  std::__cxx11::string::string<std::allocator<char>>
            (local_1b8,"Radial Distribution Function",local_1d8);
  std::__cxx11::string::_M_assign
            ((string *)&(this->super_RadialDistrFunc).super_StaticAnalyser.analysisType_);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  poVar1 = std::operator<<(local_1a8," nBins = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,", maxLen = ");
  poVar1 = std::ostream::_M_insert<double>(this->len_);
  std::operator<<(poVar1,", deltaR = ");
  poVar1 = std::ostream::_M_insert<double>(this->deltaR_);
  poVar1 = std::operator<<(poVar1,", nAngleBins = ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->nAngleBins_);
  std::operator<<(poVar1,", deltaCosAngle = ");
  std::ostream::_M_insert<double>(this->deltaCosAngle_);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign
            ((string *)&(this->super_RadialDistrFunc).super_StaticAnalyser.paramString_);
  std::__cxx11::string::~string((string *)local_1d8);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  return;
}

Assistant:

GofRAngle::GofRAngle(SimInfo* info, const std::string& filename,
                       const std::string& sele1, const std::string& sele2,
                       RealType len, int nrbins, int nangleBins) :
      RadialDistrFunc(info, filename, sele1, sele2, nrbins),
      nAngleBins_(nangleBins), len_(len), doSele3_(false), seleMan3_(info),
      evaluator3_(info) {
    deltaR_        = len_ / (double)nBins_;
    deltaCosAngle_ = 2.0 / (double)nAngleBins_;
    histogram_.resize(nBins_);
    avgGofr_.resize(nBins_);
    for (unsigned int i = 0; i < nBins_; ++i) {
      histogram_[i].resize(nAngleBins_);
      avgGofr_[i].resize(nAngleBins_);
    }

    setAnalysisType("Radial Distribution Function");

    std::stringstream params;
    params << " nBins = " << nBins_ << ", maxLen = " << len_
           << ", deltaR = " << deltaR_ << ", nAngleBins = " << nAngleBins_
           << ", deltaCosAngle = " << deltaCosAngle_;
    const std::string paramString = params.str();
    setParameterString(paramString);
  }